

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_ev.c
# Opt level: O2

CURLMcode Curl_multi_ev_assess_xfer_list(Curl_multi *multi,Curl_llist *list)

{
  CURLMcode CVar1;
  Curl_llist_node *n;
  Curl_easy *data;
  
  CVar1 = CURLM_OK;
  if ((multi != (Curl_multi *)0x0) &&
     (CVar1 = CURLM_OK, multi->socket_cb != (curl_socket_callback)0x0)) {
    n = Curl_llist_head(list);
    CVar1 = CURLM_OK;
    while ((n != (Curl_llist_node *)0x0 && (CVar1 == CURLM_OK))) {
      data = (Curl_easy *)Curl_node_elem(n);
      CVar1 = Curl_multi_ev_assess_xfer(multi,data);
      n = Curl_node_next(n);
    }
  }
  return CVar1;
}

Assistant:

CURLMcode Curl_multi_ev_assess_xfer_list(struct Curl_multi *multi,
                                         struct Curl_llist *list)
{
  struct Curl_llist_node *e;
  CURLMcode result = CURLM_OK;

  if(multi && multi->socket_cb) {
    for(e = Curl_llist_head(list); e && !result; e = Curl_node_next(e)) {
      result = Curl_multi_ev_assess_xfer(multi, Curl_node_elem(e));
    }
  }
  return result;
}